

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# programs.hpp
# Opt level: O0

void __thiscall qe::ShaderAssignments::assign(ShaderAssignments *this,string *name,string *value)

{
  value_type local_60;
  string *local_20;
  string *value_local;
  string *name_local;
  ShaderAssignments *this_local;
  
  local_20 = value;
  value_local = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_60,(string *)name);
  std::__cxx11::string::string((string *)&local_60.value,(string *)value);
  std::vector<qe::ShaderAssignments::assigns_t,_std::allocator<qe::ShaderAssignments::assigns_t>_>::
  push_back(&this->_assigns,&local_60);
  assigns_t::~assigns_t(&local_60);
  return;
}

Assistant:

void assign(std::string name, std::string value) {
            _assigns.push_back(assigns_t {name, value});
        }